

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_select
                (run_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  rle16_t *prVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  
  if (0 < container->n_runs) {
    prVar1 = container->runs;
    uVar4 = *start_rank;
    lVar2 = 0;
    do {
      uVar3 = prVar1[lVar2].length + uVar4;
      if (rank <= uVar3) {
        *element = (rank - uVar4) + (uint)prVar1[lVar2].value;
        return true;
      }
      uVar4 = uVar3 + 1;
      *start_rank = uVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 < container->n_runs);
  }
  return false;
}

Assistant:

bool run_container_select(const run_container_t *container,
                          uint32_t *start_rank, uint32_t rank,
                          uint32_t *element) {
    for (int i = 0; i < container->n_runs; i++) {
        uint16_t length = container->runs[i].length;
        if (rank <= *start_rank + length) {
            uint16_t value = container->runs[i].value;
            *element = value + rank - (*start_rank);
            return true;
        } else
            *start_rank += length + 1;
    }
    return false;
}